

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_runtime_type.h
# Opt level: O0

int density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>::
    Impl<int_(Struct::*)()>::align_invoke_destroy_impl
              (Struct *param_1,offset_in_Struct_to_subr *param_2)

{
  type tVar1;
  offset_in_Struct_to_subr *i_functor;
  type *ret;
  offset_in_Struct_to_subr *aligned_dest;
  Struct *i_params_local;
  void *i_dest_local;
  
  aligned_dest = param_2;
  i_params_local = param_1;
  i_functor = (offset_in_Struct_to_subr *)address_upper_align(param_1,8);
  tVar1 = invoke<int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*&)(),density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*>
                    (i_functor,(Struct **)&aligned_dest);
  return tVar1;
}

Assistant:

static RET_VAL
                  align_invoke_destroy_impl(std::false_type, void * i_dest, PARAMS... i_params)
                {
                    auto const aligned_dest =
                      static_cast<ACTUAL_TYPE *>(address_upper_align(i_dest, alignof(ACTUAL_TYPE)));
                    auto && ret =
                      density::detail::invoke(*aligned_dest, std::forward<PARAMS>(i_params)...);
                    aligned_dest->ACTUAL_TYPE::~ACTUAL_TYPE();
                    return ret;
                }